

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::PaddingLayerParams::CheckTypeAndMergeFrom
          (PaddingLayerParams *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  BorderAmounts *pBVar3;
  PaddingLayerParams_PaddingConstant *pPVar4;
  PaddingLayerParams_PaddingReflection *pPVar5;
  PaddingLayerParams_PaddingReplication *pPVar6;
  undefined1 *puVar7;
  Arena *pAVar8;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__PaddingLayerParams_004b5bd0) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::PaddingLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((PaddingLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6e69);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if ((from != (MessageLite *)_PaddingLayerParams_default_instance_) &&
     (from[1]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->paddingamounts_ == (BorderAmounts *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pBVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                         (pAVar8);
      this->paddingamounts_ = pBVar3;
    }
    puVar7 = (undefined1 *)from[1]._vptr_MessageLite;
    if ((BorderAmounts *)puVar7 == (BorderAmounts *)0x0) {
      puVar7 = _BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this->paddingamounts_,(BorderAmounts *)puVar7);
  }
  iVar1 = *(int *)((long)&from[2]._vptr_MessageLite + 4);
  if (iVar1 == 3) {
    if (this->_oneof_case_[0] != 3) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 3;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pPVar6 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReplication>
                         (pAVar8);
      (this->PaddingType_).replication_ = pPVar6;
    }
    if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 3) {
      puVar7 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    }
    else {
      puVar7 = _PaddingLayerParams_PaddingReplication_default_instance_;
    }
    PaddingLayerParams_PaddingReplication::MergeFrom
              ((this->PaddingType_).replication_,(PaddingLayerParams_PaddingReplication *)puVar7);
  }
  else if (iVar1 == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 2;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pPVar5 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingReflection>
                         (pAVar8);
      (this->PaddingType_).reflection_ = pPVar5;
    }
    if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 2) {
      puVar7 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    }
    else {
      puVar7 = _PaddingLayerParams_PaddingReflection_default_instance_;
    }
    PaddingLayerParams_PaddingReflection::MergeFrom
              ((this->PaddingType_).reflection_,(PaddingLayerParams_PaddingReflection *)puVar7);
  }
  else if (iVar1 == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_PaddingType(this);
      this->_oneof_case_[0] = 1;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar8 = *(Arena **)pAVar8;
      }
      pPVar4 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::PaddingLayerParams_PaddingConstant>(pAVar8)
      ;
      (this->PaddingType_).constant_ = pPVar4;
    }
    if (*(int *)((long)&from[2]._vptr_MessageLite + 4) == 1) {
      puVar7 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    }
    else {
      puVar7 = _PaddingLayerParams_PaddingConstant_default_instance_;
    }
    PaddingLayerParams_PaddingConstant::MergeFrom
              ((this->PaddingType_).constant_,(PaddingLayerParams_PaddingConstant *)puVar7);
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}